

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  uint *puVar1;
  int iVar2;
  PGroup *pPVar3;
  PCache1 *pPVar4;
  PgHdr1 *pPVar5;
  PgHdr1 **ppPVar6;
  int iVar7;
  u64 uVar8;
  int *piVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  PgHdr1 **ppPVar14;
  u64 n;
  PgHdr1 *pPVar15;
  
  pPVar3 = pCache->pGroup;
  if (createFlag == 1) {
    uVar13 = pCache->nPage - pCache->nRecyclable;
    if ((pPVar3->mxPinned <= uVar13) || (pCache->n90pct <= uVar13)) {
      return (PgHdr1 *)0x0;
    }
    if ((pcache1_g.nSlot == 0) || (pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
      piVar9 = &mem0.nearlyFull;
    }
    else {
      piVar9 = &pcache1_g.bUnderPressure;
    }
    if (*piVar9 != 0 && pCache->nRecyclable < uVar13) {
      return (PgHdr1 *)0x0;
    }
  }
  if (pCache->nHash <= pCache->nPage) {
    pcache1ResizeHash(pCache);
  }
  if ((pCache->bPurgeable == 0) || (pPVar15 = (pPVar3->lru).pLruPrev, pPVar15->isAnchor != '\0')) {
LAB_00182fe2:
    pPVar15 = (PgHdr1 *)0x0;
  }
  else {
    if (pCache->nPage + 1 < pCache->nMax) {
      if ((pcache1_g.nSlot == 0) || (pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
        piVar9 = &mem0.nearlyFull;
      }
      else {
        piVar9 = &pcache1_g.bUnderPressure;
      }
      if (*piVar9 == 0) goto LAB_00182fe2;
    }
    pPVar4 = pPVar15->pCache;
    ppPVar6 = pPVar4->apHash + (ulong)pPVar15->iKey % (ulong)pPVar4->nHash;
    do {
      ppPVar14 = ppPVar6;
      pPVar5 = *ppPVar14;
      ppPVar6 = &pPVar5->pNext;
    } while (pPVar5 != pPVar15);
    *ppPVar14 = *ppPVar6;
    pPVar4->nPage = pPVar4->nPage - 1;
    pPVar4 = pPVar15->pCache;
    pPVar5 = pPVar15->pLruPrev;
    pPVar5->pLruNext = pPVar15->pLruNext;
    pPVar15->pLruNext->pLruPrev = pPVar5;
    pPVar15->pLruNext = (PgHdr1 *)0x0;
    pPVar15->pLruPrev = (PgHdr1 *)0x0;
    pPVar15->isPinned = '\x01';
    pPVar4->nRecyclable = pPVar4->nRecyclable - 1;
    if (pPVar4->szAlloc != pCache->szAlloc) {
      pcache1FreePage(pPVar15);
      goto LAB_00182fe2;
    }
    pPVar3->nCurrentPage = pPVar3->nCurrentPage + (pCache->bPurgeable - pPVar4->bPurgeable);
  }
  if (pPVar15 != (PgHdr1 *)0x0) goto LAB_00183209;
  if (pCache->pFree == (PgHdr1 *)0x0) {
    if (((pCache->nPage == 0) && (pcache1_g.nInitPage != 0)) && (2 < pCache->nMax)) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      lVar12 = (long)pcache1_g.nInitPage;
      if (lVar12 < 1) {
        uVar8 = lVar12 * -0x400;
      }
      else {
        uVar8 = pCache->szAlloc * lVar12;
      }
      n = (ulong)pCache->nMax * (long)pCache->szAlloc;
      if ((long)uVar8 < (long)n) {
        n = uVar8;
      }
      pvVar10 = sqlite3Malloc(n);
      pCache->pBulk = pvVar10;
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pvVar10 != (void *)0x0) {
        iVar7 = (*sqlite3Config.m.xSize)(pvVar10);
        iVar2 = pCache->szAlloc;
        uVar11 = (long)iVar7 / (long)iVar2 & 0xffffffff;
        lVar12 = (long)pCache->szPage;
        pPVar15 = pCache->pFree;
        do {
          *(void **)((long)pvVar10 + lVar12) = pvVar10;
          *(long *)((long)pvVar10 + lVar12 + 8) = (long)pvVar10 + lVar12 + 0x38;
          *(undefined2 *)((long)pvVar10 + lVar12 + 0x15) = 1;
          *(PgHdr1 **)((long)pvVar10 + lVar12 + 0x18) = pPVar15;
          pPVar15 = (PgHdr1 *)((long)pvVar10 + lVar12);
          pvVar10 = (void *)((long)pvVar10 + (long)iVar2);
          uVar13 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar13;
        } while (uVar13 != 0);
        pCache->pFree = (PgHdr1 *)((long)pvVar10 + (lVar12 - iVar2));
      }
      if (pCache->pFree != (PgHdr1 *)0x0) goto LAB_00182ff5;
    }
    if ((createFlag == 1) && (sqlite3Hooks_0 != (code *)0x0)) {
      (*sqlite3Hooks_0)();
    }
    pvVar10 = pcache1Alloc(pCache->szAlloc);
    iVar2 = pCache->szPage;
    if ((createFlag == 1) && (sqlite3Hooks_1 != (code *)0x0)) {
      (*sqlite3Hooks_1)();
    }
    if (pvVar10 == (void *)0x0) {
      pPVar15 = (PgHdr1 *)0x0;
      goto LAB_00183209;
    }
    pPVar15 = (PgHdr1 *)((long)iVar2 + (long)pvVar10);
    (pPVar15->page).pBuf = pvVar10;
    (pPVar15->page).pExtra = pPVar15 + 1;
    pPVar15->isBulkLocal = '\0';
    pPVar15->isAnchor = '\0';
  }
  else {
LAB_00182ff5:
    pPVar15 = pCache->pFree;
    pCache->pFree = pPVar15->pNext;
    pPVar15->pNext = (PgHdr1 *)0x0;
  }
  if (pCache->bPurgeable != 0) {
    puVar1 = &pCache->pGroup->nCurrentPage;
    *puVar1 = *puVar1 + 1;
  }
LAB_00183209:
  if (pPVar15 != (PgHdr1 *)0x0) {
    uVar11 = (ulong)iKey % (ulong)pCache->nHash;
    pCache->nPage = pCache->nPage + 1;
    pPVar15->iKey = iKey;
    pPVar15->pNext = pCache->apHash[uVar11];
    pPVar15->pCache = pCache;
    pPVar15->pLruNext = (PgHdr1 *)0x0;
    pPVar15->pLruPrev = (PgHdr1 *)0x0;
    pPVar15->isPinned = '\x01';
    *(undefined8 *)(pPVar15->page).pExtra = 0;
    pCache->apHash[uVar11] = pPVar15;
    if (pCache->iMaxKey < iKey) {
      pCache->iMaxKey = iKey;
    }
  }
  return pPVar15;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache, 
  unsigned int iKey, 
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( pPage->isPinned==0 );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nCurrentPage -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found, 
  ** attempt to allocate a new one. 
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruPrev = 0;
    pPage->pLruNext = 0;
    pPage->isPinned = 1;
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}